

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

ch_token_kind parse_token_kind(char *token_start,size_t token_size)

{
  int iVar1;
  size_t sVar2;
  byte local_21;
  uint8_t i;
  size_t token_size_local;
  char *token_start_local;
  
  local_21 = 0;
  while( true ) {
    if (0xb < local_21) {
      return TK_ID;
    }
    sVar2 = strlen(keywords[local_21].name);
    if ((token_size == sVar2) &&
       (iVar1 = strncmp(token_start,keywords[local_21].name,token_size), iVar1 == 0)) break;
    local_21 = local_21 + 1;
  }
  return keywords[local_21].kind;
}

Assistant:

ch_token_kind parse_token_kind(const char *token_start, size_t token_size) {
  for (uint8_t i = 0; i < num_keywords; i++) {
    if (token_size != strlen(keywords[i].name)) {
      continue;
    }

    if (strncmp(token_start, keywords[i].name, token_size) == 0) {
      return keywords[i].kind;
    }
  }

  return TK_ID;
}